

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

int f2(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype *dydata;
  sunrealtype *ydata;
  sunrealtype d;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = N_VGetArrayPointer(in_RDI);
  lVar2 = N_VGetArrayPointer(in_RSI);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
      lVar3 = local_28 + local_30 * 5;
      local_40 = *(double *)(lVar1 + lVar3 * 8) * -2.0;
      if (local_28 != 0) {
        local_40 = *(double *)(lVar1 + (lVar3 + -1) * 8) + local_40;
      }
      if (local_30 != 0) {
        local_40 = *(double *)(lVar1 + (lVar3 + -5) * 8) + local_40;
      }
      *(double *)(lVar2 + lVar3 * 8) = local_40;
    }
  }
  return 0;
}

Assistant:

static int f2(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunindextype i, j, k;
  sunrealtype d, *ydata, *dydata;

  ydata  = N_VGetArrayPointer(y);
  dydata = N_VGetArrayPointer(ydot);

  /*
     Excluding boundaries,

     ydot    = f    = -2 y    + alpha1 * y      + alpha2 * y
         i,j    i,j       i,j             i-1,j             i,j-1
  */

  for (j = 0; j < P2_MESHY; j++)
  {
    for (i = 0; i < P2_MESHX; i++)
    {
      k = i + j * P2_MESHX;
      d = -TWO * ydata[k];
      if (i != 0) { d += P2_ALPH1 * ydata[k - 1]; }
      if (j != 0) { d += P2_ALPH2 * ydata[k - P2_MESHX]; }
      dydata[k] = d;
    }
  }

  return (0);
}